

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_fp16s(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  float *pfVar1;
  Mat *this_01;
  uint _h;
  size_t sVar2;
  void *pvVar3;
  _func_int *p_Var4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  void *pvVar9;
  unsigned_short uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int _w;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  unsigned_short *puVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  Mat local_c0;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  long local_38;
  
  this_01 = (Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  _h = this_01[-2].h;
  uVar24 = (ulong)(int)_h;
  _w = this_01[-2].c / (int)_h;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    if ((uVar24 & 7) == 0) {
      Mat::reshape(&local_c0,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x10,8,(Allocator *)0x0);
      lVar16 = 7;
      lVar17 = 6;
      lVar18 = 5;
      lVar19 = 4;
      lVar11 = 3;
      lVar13 = 2;
      lVar14 = 1;
      lVar15 = 0;
      for (uVar20 = 0; pvVar9 = local_c0.data, (long)(uVar20 | 7) < (long)uVar24;
          uVar20 = uVar20 + 8) {
        local_38 = (long)(this->weight_data_tm).w;
        local_40 = (this->weight_data_tm).data;
        sVar2 = (this->weight_data_tm).elemsize;
        puVar25 = (unsigned_short *)((uVar20 >> 3) * local_38 * sVar2 + (long)local_40);
        lVar23 = (long)local_c0.w;
        lVar21 = sVar2 * lVar15 * local_38;
        lVar22 = 0;
        lVar26 = 0;
        for (iVar12 = 0; iVar12 + 7 < _w; iVar12 = iVar12 + 8) {
          auVar27 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * uVar20 * lVar23),3);
          auVar29 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar14 * lVar23),3);
          auVar31 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar13 * lVar23),3);
          auVar32 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar11 * lVar23),3);
          auVar33 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar19 * lVar23),3);
          auVar34 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar18 * lVar23),3);
          auVar35 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar17 * lVar23),3);
          auVar36 = vcvtps2ph_f16c(*(undefined1 (*) [32])
                                    ((long)local_c0.data +
                                    lVar26 + local_c0.elemsize * lVar16 * lVar23),3);
          auVar7 = vpunpcklwd_avx(auVar27,auVar29);
          auVar27 = vpunpckhwd_avx(auVar27,auVar29);
          auVar8 = vpunpcklwd_avx(auVar31,auVar32);
          auVar29 = vpunpckhwd_avx(auVar31,auVar32);
          auVar6 = vpunpcklwd_avx(auVar33,auVar34);
          auVar31 = vpunpckhwd_avx(auVar33,auVar34);
          auVar33 = vpunpcklwd_avx(auVar35,auVar36);
          auVar32 = vpunpckhwd_avx(auVar35,auVar36);
          auVar34 = vpunpckldq_avx(auVar7,auVar8);
          auVar7 = vpunpckhdq_avx(auVar7,auVar8);
          auVar8 = vpunpckldq_avx(auVar27,auVar29);
          auVar27 = vpunpckhdq_avx(auVar27,auVar29);
          auVar35 = vpunpckldq_avx(auVar6,auVar33);
          auVar29 = vpunpckhdq_avx(auVar6,auVar33);
          auVar6 = vpunpckldq_avx(auVar31,auVar32);
          auVar31 = vpunpckhdq_avx(auVar31,auVar32);
          auVar33 = vpunpcklqdq_avx(auVar34,auVar35);
          auVar32 = vpunpckhqdq_avx(auVar34,auVar35);
          auVar34 = vpunpcklqdq_avx(auVar7,auVar29);
          auVar29 = vpunpckhqdq_avx(auVar7,auVar29);
          auVar35 = vpunpcklqdq_avx(auVar8,auVar6);
          auVar7 = vpunpckhqdq_avx(auVar8,auVar6);
          auVar8 = vpunpcklqdq_avx(auVar27,auVar31);
          auVar27 = vpunpckhqdq_avx(auVar27,auVar31);
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21) = auVar33;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x10) = auVar32;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x20) = auVar34;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x30) = auVar29;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x40) = auVar35;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x50) = auVar7;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x60) = auVar8;
          *(undefined1 (*) [16])((long)local_40 + lVar26 * 4 + lVar21 + 0x70) = auVar27;
          puVar25 = puVar25 + 0x40;
          lVar26 = lVar26 + 0x20;
          lVar22 = lVar22 + 8;
        }
        lVar23 = local_c0.elemsize * lVar23;
        local_78 = lVar14;
        local_70 = lVar13;
        local_68 = lVar11;
        local_60 = lVar19;
        local_58 = lVar18;
        local_50 = lVar17;
        local_48 = lVar16;
        for (; (int)lVar22 < _w; lVar22 = lVar22 + 1) {
          pfVar1 = (float *)((long)pvVar9 + lVar22 * 4 + lVar23 * uVar20);
          uVar10 = float32_to_float16(*pfVar1);
          *puVar25 = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pfVar1 + lVar23));
          puVar25[1] = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pfVar1 + lVar23 * 2));
          puVar25[2] = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pfVar1 + lVar23 * 3));
          puVar25[3] = uVar10;
          uVar10 = float32_to_float16(pfVar1[lVar23]);
          puVar25[4] = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pfVar1 + lVar23 * 5));
          puVar25[5] = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pfVar1 + lVar23 * 6));
          puVar25[6] = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pfVar1 + lVar23 * 7));
          puVar25[7] = uVar10;
          puVar25 = puVar25 + 8;
        }
        lVar16 = local_48 + 8;
        lVar17 = local_50 + 8;
        lVar18 = local_58 + 8;
        lVar19 = local_60 + 8;
        lVar11 = local_68 + 8;
        lVar13 = local_70 + 8;
        lVar14 = local_78 + 8;
        lVar15 = lVar15 + 1;
      }
      if (local_c0.refcount == (int *)0x0) goto LAB_002d3d29;
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount != 0) goto LAB_002d3d29;
      if (local_c0.allocator != (Allocator *)0x0) {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
        goto LAB_002d3d29;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002d36d7;
      Mat::reshape(&local_c0,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,8,4,(Allocator *)0x0);
      lVar16 = 3;
      lVar17 = 2;
      lVar18 = 1;
      lVar19 = 0;
      for (uVar20 = 0; pvVar9 = local_c0.data, (long)(uVar20 | 3) < (long)uVar24;
          uVar20 = uVar20 + 4) {
        lVar13 = (long)local_c0.w;
        lVar23 = (this->weight_data_tm).elemsize * lVar19 * (long)(this->weight_data_tm).w;
        pvVar3 = (this->weight_data_tm).data;
        lVar14 = local_c0.elemsize * uVar20 * lVar13;
        lVar26 = local_c0.elemsize * lVar18 * lVar13;
        lVar21 = local_c0.elemsize * lVar17 * lVar13;
        lVar13 = local_c0.elemsize * lVar16 * lVar13;
        lVar15 = 0;
        lVar11 = 0;
        for (iVar12 = 0; iVar12 + 3 < _w; iVar12 = iVar12 + 4) {
          auVar27 = *(undefined1 (*) [16])((long)local_c0.data + lVar11 + lVar14);
          auVar29 = *(undefined1 (*) [16])((long)local_c0.data + lVar11 + lVar26);
          auVar31 = *(undefined1 (*) [16])((long)local_c0.data + lVar11 + lVar21);
          auVar32 = *(undefined1 (*) [16])((long)local_c0.data + lVar11 + lVar13);
          auVar7 = vpunpckldq_avx(auVar27,auVar29);
          auVar8 = vpunpckldq_avx(auVar31,auVar32);
          auVar27 = vpunpckhdq_avx(auVar27,auVar29);
          auVar29 = vpunpckhdq_avx(auVar31,auVar32);
          auVar32 = vpunpcklqdq_avx(auVar7,auVar8);
          auVar31 = vpunpckhqdq_avx(auVar7,auVar8);
          auVar7 = vpunpcklqdq_avx(auVar27,auVar29);
          auVar27 = vpunpckhqdq_avx(auVar27,auVar29);
          auVar30._16_16_ = auVar31;
          auVar30._0_16_ = auVar32;
          auVar28._16_16_ = auVar27;
          auVar28._0_16_ = auVar7;
          auVar27 = vcvtps2ph_f16c(auVar30,3);
          *(undefined1 (*) [16])((long)pvVar3 + lVar11 * 2 + lVar23) = auVar27;
          auVar27 = vcvtps2ph_f16c(auVar28,3);
          *(undefined1 (*) [16])((long)pvVar3 + lVar11 * 2 + lVar23 + 0x10) = auVar27;
          lVar11 = lVar11 + 0x10;
          lVar15 = lVar15 + 4;
        }
        for (; (int)lVar15 < _w; lVar15 = lVar15 + 1) {
          uVar10 = float32_to_float16(*(float *)((long)pvVar9 + lVar15 * 4 + lVar14));
          *(unsigned_short *)((long)pvVar3 + lVar15 * 8 + lVar23) = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pvVar9 + lVar15 * 4 + lVar26));
          *(unsigned_short *)((long)pvVar3 + lVar15 * 8 + lVar23 + 2) = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pvVar9 + lVar15 * 4 + lVar21));
          *(unsigned_short *)((long)pvVar3 + lVar15 * 8 + lVar23 + 4) = uVar10;
          uVar10 = float32_to_float16(*(float *)((long)pvVar9 + lVar15 * 4 + lVar13));
          *(unsigned_short *)((long)pvVar3 + lVar15 * 8 + lVar23 + 6) = uVar10;
        }
        lVar19 = lVar19 + 1;
        lVar18 = lVar18 + 4;
        lVar17 = lVar17 + 4;
        lVar16 = lVar16 + 4;
      }
      if (local_c0.refcount == (int *)0x0) goto LAB_002d3d29;
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount != 0) goto LAB_002d3d29;
      if (local_c0.allocator != (Allocator *)0x0) {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
        goto LAB_002d3d29;
      }
    }
  }
  else {
LAB_002d36d7:
    Mat::reshape(&local_c0,this_01,_w,_h,(Allocator *)0x0);
    cast_float32_to_float16(&local_c0,this_00,opt);
    if (local_c0.refcount == (int *)0x0) goto LAB_002d3d29;
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount != 0) goto LAB_002d3d29;
    if (local_c0.allocator != (Allocator *)0x0) {
      (*(local_c0.allocator)->_vptr_Allocator[3])();
      goto LAB_002d3d29;
    }
  }
  free(local_c0.data);
LAB_002d3d29:
  if (opt->lightmode == true) {
    p_Var4 = this->_vptr_InnerProduct_x86_fma[-3];
    piVar5 = *(int **)(&this->field_0x138 + (long)p_Var4);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var4) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var4));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var4) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var4) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var4) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}